

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::read_access_chain_array
          (CompilerHLSL *this,string *lhs,SPIRAccessChain *chain)

{
  SPIRType *pSVar1;
  string *ts_3;
  _Alloc_hider in_stack_fffffffffffffee8;
  string ident;
  SPIRAccessChain subchain;
  
  pSVar1 = Compiler::get<spirv_cross::SPIRType>
                     ((Compiler *)this,*(uint32_t *)&(chain->super_IVariant).field_0xc);
  get_unique_identifier_abi_cxx11_(&ident,this);
  CompilerGLSL::statement<char_const(&)[9]>(&this->super_CompilerGLSL,(char (*) [9])"[unroll]");
  CompilerGLSL::to_array_size_abi_cxx11_
            ((string *)&subchain,&this->super_CompilerGLSL,pSVar1,
             (int)(pSVar1->array).super_VectorView<unsigned_int>.buffer_size - 1);
  CompilerGLSL::
  statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
            (&this->super_CompilerGLSL,(char (*) [10])"for (int ",&ident,(char (*) [7])" = 0; ",
             &ident,(char (*) [4])" < ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&subchain,
             (char (*) [3])0x2ae33a,&ident,(char (*) [4])0x2ce0bc);
  ::std::__cxx11::string::~string((string *)&subchain);
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  SPIRAccessChain::SPIRAccessChain(&subchain,chain);
  ts_3 = &chain->dynamic_index;
  join<std::__cxx11::string&,char_const(&)[4],unsigned_int_const&,char_const(&)[4],std::__cxx11::string_const&>
            ((string *)&stack0xfffffffffffffee8,(spirv_cross *)&ident,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2be2a8,
             (char (*) [4])&chain->array_stride,(uint *)0x2b5f2e,(char (*) [4])ts_3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffee8._M_p);
  ::std::__cxx11::string::operator=
            ((string *)&subchain.dynamic_index,(string *)&stack0xfffffffffffffee8);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
  subchain.super_IVariant._12_4_ = (pSVar1->parent_type).id;
  pSVar1 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,subchain.super_IVariant._12_4_);
  if ((pSVar1->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    subchain.array_stride =
         Compiler::get_decoration
                   ((Compiler *)this,(ID)subchain.super_IVariant._12_4_,DecorationArrayStride);
  }
  join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
            ((string *)&stack0xfffffffffffffee8,(spirv_cross *)lhs,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2a2336,
             (char (*) [2])&ident,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2ad9aa,
             (char (*) [2])ts_3);
  read_access_chain(this,(string *)0x0,(string *)&stack0xfffffffffffffee8,&subchain);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  SPIRAccessChain::~SPIRAccessChain(&subchain);
  ::std::__cxx11::string::~string((string *)&ident);
  return;
}

Assistant:

void CompilerHLSL::read_access_chain_array(const string &lhs, const SPIRAccessChain &chain)
{
	auto &type = get<SPIRType>(chain.basetype);

	// Need to use a reserved identifier here since it might shadow an identifier in the access chain input or other loops.
	auto ident = get_unique_identifier();

	statement("[unroll]");
	statement("for (int ", ident, " = 0; ", ident, " < ", to_array_size(type, uint32_t(type.array.size() - 1)), "; ",
	          ident, "++)");
	begin_scope();
	auto subchain = chain;
	subchain.dynamic_index = join(ident, " * ", chain.array_stride, " + ", chain.dynamic_index);
	subchain.basetype = type.parent_type;
	if (!get<SPIRType>(subchain.basetype).array.empty())
		subchain.array_stride = get_decoration(subchain.basetype, DecorationArrayStride);
	read_access_chain(nullptr, join(lhs, "[", ident, "]"), subchain);
	end_scope();
}